

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composite.cpp
# Opt level: O2

bool spvtools::opt::ExtInsMatch
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *extIndices,Instruction *insInst
               ,uint32_t extOffset)

{
  uint32_t uVar1;
  uint32_t uVar2;
  ulong uVar3;
  uint uVar4;
  bool bVar5;
  
  uVar4 = (int)((ulong)((long)(extIndices->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(extIndices->
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                             _M_impl.super__Vector_impl_data._M_start) >> 2) - extOffset;
  uVar1 = Instruction::NumInOperands(insInst);
  if (uVar4 == uVar1 - 2) {
    uVar3 = 0;
    do {
      bVar5 = uVar4 == uVar3;
      if (bVar5) {
        return bVar5;
      }
      uVar1 = (extIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start[extOffset + (int)uVar3];
      uVar2 = Instruction::GetSingleWordInOperand(insInst,(int)uVar3 + 2);
      uVar3 = uVar3 + 1;
    } while (uVar1 == uVar2);
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool ExtInsMatch(const std::vector<uint32_t>& extIndices,
                 const Instruction* insInst, const uint32_t extOffset) {
  uint32_t numIndices = static_cast<uint32_t>(extIndices.size()) - extOffset;
  if (numIndices != insInst->NumInOperands() - 2) return false;
  for (uint32_t i = 0; i < numIndices; ++i)
    if (extIndices[i + extOffset] != insInst->GetSingleWordInOperand(i + 2))
      return false;
  return true;
}